

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O3

bool __thiscall
wasm::anon_unknown_23::EscapeAnalyzer::escapes(EscapeAnalyzer *this,Expression *allocation)

{
  byte bVar1;
  BranchTargets *this_00;
  size_t sVar2;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *pSVar3;
  _Hash_node_base _Var4;
  Name name;
  pair<wasm::Expression_*,_wasm::Expression_*> pVar5;
  bool bVar6;
  const_iterator cVar7;
  Expression **ppEVar9;
  Expression *pEVar10;
  __node_base _Var11;
  mapped_type *pmVar12;
  SetInfluences *pSVar13;
  const_iterator cVar14;
  anon_class_8_1_ba1d7401 *paVar15;
  _Rb_tree_node_base *p_Var16;
  __node_base *p_Var17;
  _Hash_node_base *p_Var18;
  _Hash_node_base *p_Var19;
  long *plVar20;
  mapped_type mVar21;
  anon_class_8_1_8991fb9c *paVar22;
  ulong uVar23;
  _Base_ptr p_Var24;
  Switch *cast;
  pair<wasm::Expression_*,_wasm::Expression_*> pVar25;
  anon_class_16_2_3f140c08 func;
  pair<wasm::Expression_*,_wasm::Expression_*> item;
  pair<wasm::Expression_*,_wasm::Expression_*> item_00;
  pair<wasm::Expression_*,_wasm::Expression_*> item_01;
  pair<wasm::Expression_*,_wasm::Expression_*> item_02;
  undefined1 auStack_1a8 [8];
  UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_> flows;
  undefined1 local_d8 [8];
  LocalGet *get;
  size_t local_c8;
  _Rb_tree_const_iterator<wasm::LocalSet_*> local_c0;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *local_b8;
  Expression *child;
  _Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_a8;
  __hashtable *__h;
  Expression *parent;
  unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
  gets;
  undefined1 auStack_58 [8];
  LocalSet *set;
  size_t local_48;
  _Rb_tree_const_iterator<wasm::LocalSet_*> local_40;
  mapped_type local_31;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *pSVar8;
  __hashtable *expr;
  
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.data.c.
  super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.data.c.
  super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.data.c.
  super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.data.c.
  super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.data.c.
  super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.data.c.
  super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.data.c.
  super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.data.c.
  super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  auStack_1a8 = (undefined1  [8])0x0;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.data.c.
  super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::
  _Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
  ::_M_initialize_map((_Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
                       *)auStack_1a8,0);
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.data.c.
  super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)
       &flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.count.
        _M_h._M_rehash_policy._M_next_resize;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.count._M_h.
  _M_buckets = (__buckets_ptr)0x1;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.count._M_h.
  _M_bucket_count = 0;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.count._M_h.
  _M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.count._M_h.
  _M_element_count._0_4_ = 0x3f800000;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.count._M_h.
  _M_rehash_policy._M_max_load_factor = 0.0;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.count._M_h.
  _M_rehash_policy._4_4_ = 0;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.count._M_h.
  _M_rehash_policy._M_next_resize = 0;
  flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.count._M_h.
  _M_single_bucket = (__node_base_ptr)&flows.processed._M_h._M_rehash_policy._M_next_resize;
  flows.processed._M_h._M_buckets = (__buckets_ptr)0x1;
  flows.processed._M_h._M_bucket_count = 0;
  flows.processed._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  flows.processed._M_h._M_element_count._0_4_ = 0x3f800000;
  flows.processed._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  flows.processed._M_h._M_rehash_policy._4_4_ = 0;
  flows.processed._M_h._M_rehash_policy._M_next_resize = 0;
  parent = allocation;
  cVar7 = std::
          _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->parents->inner).parentMap._M_h,&parent);
  if (cVar7.super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Expression_*>,_false>
      ._M_cur == (__node_type *)0x0) {
    pEVar10 = (Expression *)0x0;
  }
  else {
    pEVar10 = *(Expression **)
               ((long)cVar7.
                      super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Expression_*>,_false>
                      ._M_cur + 0x10);
  }
  item.second = pEVar10;
  item.first = allocation;
  UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::push
            ((UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_> *)
             auStack_1a8,item);
  local_a8 = &(this->sets)._M_h;
  child = (Expression *)&this->reachedInteractions;
LAB_008b436d:
  if (((long)((long)flows.
                    super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.
                    data.c.
                    super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first -
             flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.
             data.c.
             super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
             ._M_impl.super__Deque_impl_data._M_map_size) >> 4) +
      ((long)flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.
             data.c.
             super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node -
       (long)flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.
             data.c.
             super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur >> 4) +
      ((((ulong)((long)flows.
                       super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>
                       .data.c.
                       super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_last -
                (long)flows.
                      super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.
                      data.c.
                      super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last) >> 3) - 1) +
      (ulong)(flows.super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.
              data.c.
              super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_last == (_Elt_pointer)0x0)) * 0x20 == 0)
  goto LAB_008b48d4;
  pVar25 = UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::pop
                     ((UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>
                       *)auStack_1a8);
  expr = (__hashtable *)pVar25.second;
  pSVar8 = (SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
            *)pVar25.first;
  if (expr == (__hashtable *)0x0) goto switchD_008b4407_caseD_2;
  mVar21 = FullyConsumes;
  __h = expr;
  pVar5 = pVar25;
  local_b8 = pSVar8;
  switch(*(Id *)&expr->_M_buckets) {
  case BlockId:
  case LoopId:
  case BreakId:
  case SwitchId:
  case LocalGetId:
  case LocalSetId:
    goto switchD_008b4407_caseD_1;
  case IfId:
  case CallId:
  case CallIndirectId:
  case GlobalGetId:
  case GlobalSetId:
  case LoadId:
  case StoreId:
  case ConstId:
  case UnaryId:
  case BinaryId:
  case SelectId:
  case ReturnId:
  case MemorySizeId:
  case MemoryGrowId:
  case NopId:
  case UnreachableId:
  case AtomicRMWId:
  case AtomicCmpxchgId:
  case AtomicWaitId:
  case AtomicNotifyId:
  case AtomicFenceId:
  case SIMDExtractId:
  case SIMDReplaceId:
  case SIMDShuffleId:
  case SIMDTernaryId:
  case SIMDShiftId:
  case SIMDLoadId:
  case SIMDLoadStoreLaneId:
  case MemoryInitId:
  case DataDropId:
  case MemoryCopyId:
  case MemoryFillId:
  case PopId:
  case RefNullId:
  case RefFuncId:
  case TableGetId:
  case TableSetId:
  case TableSizeId:
  case TableGrowId:
  case TableFillId:
  case TableCopyId:
  case TableInitId:
  case TryId:
  case TryTableId:
  case ThrowId:
  case RethrowId:
  case ThrowRefId:
  case TupleMakeId:
  case TupleExtractId:
  case RefI31Id:
  case I31GetId:
  case CallRefId:
  case BrOnId:
  case StructNewId:
  case ArrayNewId:
  case ArrayNewDataId:
  case ArrayNewElemId:
  case ArrayNewFixedId:
  case ArrayLenId:
  case ArrayCopyId:
  case ArrayFillId:
  case ArrayInitDataId:
  case ArrayInitElemId:
  case StringNewId:
  case StringConstId:
  case StringMeasureId:
  case StringEncodeId:
  case StringConcatId:
  case StringEqId:
  case StringWTF16GetId:
  case StringSliceWTFId:
  case ContNewId:
  case ContBindId:
  case SuspendId:
  case ResumeId:
  case ResumeThrowId:
  case StackSwitchId:
    goto switchD_008b4407_caseD_2;
  case DropId:
  case RefIsNullId:
  case RefEqId:
  case RefTestId:
  case StructGetId:
    break;
  case RefCastId:
    bVar6 = wasm::Type::isSubType
                      ((Type)(allocation->type).id,(Type)((Type *)&expr->_M_bucket_count)->id);
    pVar5.second = (Expression *)__h;
    pVar5.first = (Expression *)local_b8;
    pVar25.second = (Expression *)expr;
    pVar25.first = (Expression *)local_b8;
    if (bVar6) goto switchD_008b4407_caseD_1;
    break;
  case StructSetId:
  case StructRMWId:
    pSVar3 = (SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
              *)expr->_M_element_count;
    goto joined_r0x008b4584;
  case StructCmpxchgId:
    if ((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
         *)expr->_M_element_count != pSVar8) {
      pSVar3 = *(SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                 **)&expr->_M_rehash_policy;
      goto joined_r0x008b4584;
    }
    break;
  case ArrayGetId:
    if (*(char *)expr->_M_element_count != '\x0e') goto switchD_008b4407_caseD_2;
    break;
  case ArraySetId:
    if (*(char *)expr->_M_element_count != '\x0e') goto switchD_008b4407_caseD_2;
    pSVar3 = (SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
              *)(expr->_M_before_begin)._M_nxt;
joined_r0x008b4584:
    if (pSVar3 != pSVar8) goto switchD_008b4407_caseD_2;
    break;
  case RefAsId:
    if (*(int *)&(expr->_M_before_begin)._M_nxt != 0) goto switchD_008b4407_caseD_2;
switchD_008b4407_caseD_1:
    __h = (__hashtable *)pVar5.second;
    local_b8 = (SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                *)pVar5.first;
    pVar25.second = (Expression *)expr;
    pVar25.first = (Expression *)local_b8;
    uVar23 = ((Type *)&expr->_M_bucket_count)->id;
    if ((uVar23 & 1) == 0 && 6 < uVar23) {
      parent = (Expression *)expr;
      ppEVar9 = Properties::getImmediateFallthroughPtr
                          (&parent,this->passOptions,this->wasm,AllowTeeBrIf);
      if ((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
           *)*ppEVar9 != pSVar8) {
        this_00 = this->branchTargets;
        auStack_58 = (undefined1  [8])0x0;
        set._0_1_ = '\0';
        set._1_7_ = 0;
        BranchUtils::
        operateOnScopeNameDefs<wasm::BranchUtils::getDefinedName(wasm::Expression*)::_lambda(wasm::Name&)_1_>
                  ((Expression *)expr,(Name *)auStack_58);
        paVar15 = (anon_class_8_1_ba1d7401 *)CONCAT71(set._1_7_,(char)set);
        name.super_IString.str._M_str._0_1_ = (char)set;
        name.super_IString.str._M_len = (size_t)auStack_58;
        name.super_IString.str._M_str._1_7_ = set._1_7_;
        BranchUtils::BranchTargets::getBranches
                  ((unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
                    *)&parent,this_00,name);
        if (gets._M_h._M_before_begin._M_nxt == (_Hash_node_base *)0x1) {
          local_d8 = *(undefined1 (*) [8])(gets._M_h._M_bucket_count + 8);
          gets._M_h._M_single_bucket = (__node_base_ptr)0x0;
          auStack_58 = (undefined1  [8])&gets._M_h._M_single_bucket;
          func.func = paVar15;
          func.expr = (Expression **)auStack_58;
          BranchUtils::
          operateOnScopeNameUses<wasm::BranchUtils::operateOnScopeNameUsesAndSentValues<wasm::BranchUtils::getSentValue(wasm::Expression*)::_lambda(wasm::Name,wasm::Expression*)_1_>(wasm::Expression*,wasm::BranchUtils::getSentValue(wasm::Expression*)::_lambda(wasm::Name,wasm::Expression*)_1_)::_lambda(wasm::Name&)_1_>
                    ((BranchUtils *)local_d8,(Expression *)local_d8,func);
          if (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                *)gets._M_h._M_single_bucket == pSVar8) && (*(Id *)&expr->_M_buckets == BlockId)) {
            sVar2 = (expr->_M_rehash_policy)._M_next_resize;
            if (sVar2 == 0) {
              __assert_fail("usedElements > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                            ,0xd0,
                            "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                           );
            }
            if (*(long *)(*(long *)(*(long *)&expr->_M_rehash_policy + -8 + sVar2 * 8) + 8) == 1) {
              std::
              _Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::~_Hashtable((_Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             *)&parent);
              expr = __h;
              goto LAB_008b450f;
            }
          }
        }
        std::
        _Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)&parent);
        pVar25.second = (Expression *)__h;
        pVar25.first = (Expression *)local_b8;
switchD_008b4407_caseD_2:
        bVar6 = true;
        goto LAB_008b4a6d;
      }
LAB_008b450f:
      parent = (Expression *)expr;
      cVar7 = std::
              _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->parents->inner).parentMap._M_h,&parent);
      if (cVar7.
          super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Expression_*>,_false>.
          _M_cur == (__node_type *)0x0) {
        pEVar10 = (Expression *)0x0;
      }
      else {
        pEVar10 = *(Expression **)
                   ((long)cVar7.
                          super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Expression_*>,_false>
                          ._M_cur + 0x10);
      }
      item_00.second = pEVar10;
      item_00.first = (Expression *)expr;
      UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::push
                ((UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>
                  *)auStack_1a8,item_00);
      pVar25.second = (Expression *)__h;
      pVar25.first = (Expression *)local_b8;
      mVar21 = Flows;
    }
    break;
  default:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                       ,0x46);
  }
  pSVar8 = (SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
            *)pVar25.second;
  local_b8 = (SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
              *)pVar25.first;
  auStack_58 = (undefined1  [8])
               (SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                *)0x0;
  if (*(char *)&(pSVar8->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used == '\t') {
    auStack_58 = (undefined1  [8])pSVar8;
  }
  local_31 = mVar21;
  if (auStack_58 != (undefined1  [8])0x0) {
    parent = (Expression *)local_a8;
    std::
    _Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<wasm::LocalSet*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::LocalSet*,false>>>>
              ((_Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_a8,auStack_58,&parent);
    pSVar13 = LazyLocalGraph::getSetInfluences(this->localGraph,(LocalSet *)auStack_58);
    p_Var17 = &(pSVar13->_M_h)._M_before_begin;
    while (p_Var17 = p_Var17->_M_nxt, p_Var17 != (__node_base *)0x0) {
      _Var4._M_nxt = p_Var17[1]._M_nxt;
      parent = (Expression *)_Var4._M_nxt;
      cVar7 = std::
              _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->parents->inner).parentMap._M_h,&parent);
      if (cVar7.
          super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Expression_*>,_false>.
          _M_cur == (__node_type *)0x0) {
        pEVar10 = (Expression *)0x0;
      }
      else {
        pEVar10 = *(Expression **)
                   ((long)cVar7.
                          super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Expression_*>,_false>
                          ._M_cur + 0x10);
      }
      item_01.second = pEVar10;
      item_01.first = (Expression *)_Var4._M_nxt;
      UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::push
                ((UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>
                  *)auStack_1a8,item_01);
    }
  }
  pSVar3 = local_b8;
  local_d8 = (undefined1  [8])local_b8;
  gets._M_h._M_buckets = (__buckets_ptr)((ulong)gets._M_h._M_buckets & 0xffffffff00000000);
  gets._M_h._M_bucket_count = 0;
  gets._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  gets._M_h._M_rehash_policy._4_4_ = 0;
  auStack_58 = (undefined1  [8])local_d8;
  set._0_1_ = (char)&parent;
  set._1_7_ = (undefined7)((ulong)&parent >> 8);
  bVar1 = *(byte *)&(pSVar8->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
  gets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)&gets;
  gets._M_h._M_element_count = (size_type)&gets;
  _Var11._M_nxt = (_Hash_node_base *)&gets;
  if (bVar1 < 0x37) {
    if (bVar1 < 0x34) {
      if (bVar1 == 4) {
LAB_008b4815:
        BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
                  ((anon_class_16_2_3f140c08 *)pSVar8,(Name *)auStack_58);
        _Var11._M_nxt = gets._M_h._M_before_begin._M_nxt;
      }
      else if (bVar1 == 5) {
        BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
                  ((anon_class_16_2_3f140c08 *)pSVar8,(Name *)auStack_58);
        _Var11._M_nxt = gets._M_h._M_before_begin._M_nxt;
        if (*(Expression **)&(pSVar8->flexible)._M_t._M_impl != (Expression *)0x0) {
          pEVar10 = (Expression *)0x1;
          do {
            BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
                      ((anon_class_16_2_3f140c08 *)pSVar8,(Name *)auStack_58);
            bVar6 = pEVar10 < *(Expression **)&(pSVar8->flexible)._M_t._M_impl;
            pEVar10 = (Expression *)(ulong)((int)pEVar10 + 1);
            _Var11 = gets._M_h._M_before_begin;
          } while (bVar6);
        }
      }
      else if (bVar1 == 0) {
LAB_008b48bc:
        handle_unreachable("unexpected expression type",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                           ,0x103);
      }
    }
    else {
      if (bVar1 == 0x34) goto LAB_008b4815;
      if ((bVar1 == 0x35) &&
         ((pSVar8->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
        uVar23 = 1;
        do {
          BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
                    ((anon_class_16_2_3f140c08 *)pSVar8,(Name *)auStack_58);
          bVar6 = uVar23 < (pSVar8->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count;
          uVar23 = (ulong)((int)uVar23 + 1);
          _Var11 = gets._M_h._M_before_begin;
        } while (bVar6);
      }
    }
  }
  else if (bVar1 < 0x5d) {
    if ((bVar1 == 0x37) || (bVar1 == 0x40)) goto LAB_008b4815;
  }
  else if (bVar1 == 0x5d) {
    if ((pSVar8->flexible)._M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0)
    {
      p_Var24 = (_Base_ptr)0x1;
      do {
        BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
                  ((anon_class_16_2_3f140c08 *)pSVar8,(Name *)auStack_58);
        bVar6 = p_Var24 < (pSVar8->flexible)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
        p_Var24 = (_Base_ptr)(ulong)((int)p_Var24 + 1);
        _Var11 = gets._M_h._M_before_begin;
      } while (bVar6);
    }
  }
  else if (bVar1 == 0x5e) {
    if ((anon_class_8_1_8991fb9c *)
        pSVar8[1].fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used !=
        (anon_class_8_1_8991fb9c *)0x0) {
      paVar22 = (anon_class_8_1_8991fb9c *)0x1;
      do {
        BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
                  ((anon_class_16_2_3f140c08 *)pSVar8,(Name *)auStack_58);
        bVar6 = paVar22 < (anon_class_8_1_8991fb9c *)
                          pSVar8[1].fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
        paVar22 = (anon_class_8_1_8991fb9c *)(ulong)((int)paVar22 + 1);
        _Var11 = gets._M_h._M_before_begin;
      } while (bVar6);
    }
  }
  else if (bVar1 == 0x60) goto LAB_008b48bc;
  for (; (_Rb_tree_node_base *)_Var11._M_nxt != (_Rb_tree_node_base *)&gets;
      _Var11._M_nxt = (_Hash_node_base *)std::_Rb_tree_increment(_Var11._M_nxt)) {
    pEVar10 = BranchUtils::BranchTargets::getTarget
                        (this->branchTargets,(Name)*(string_view *)((long)_Var11._M_nxt + 0x20));
    item_02.second = pEVar10;
    item_02.first = (Expression *)pSVar3;
    UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::push
              ((UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>
                *)auStack_1a8,item_02);
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&parent);
  pmVar12 = std::
            unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
            ::operator[]((unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
                          *)child,(key_type *)&local_b8);
  mVar21 = local_31;
  *pmVar12 = Flows;
  pmVar12 = std::
            unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
            ::operator[]((unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
                          *)child,(key_type *)&__h);
  *pmVar12 = mVar21;
  goto LAB_008b436d;
LAB_008b48d4:
  parent = (Expression *)&gets._M_h._M_rehash_policy._M_next_resize;
  gets._M_h._M_buckets = (__buckets_ptr)0x1;
  gets._M_h._M_bucket_count = 0;
  gets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  gets._M_h._M_element_count = CONCAT44(gets._M_h._M_element_count._4_4_,0x3f800000);
  gets._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  gets._M_h._M_rehash_policy._4_4_ = 0;
  gets._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var18 = (this->sets)._M_h._M_before_begin._M_nxt;
  if (p_Var18 != (_Hash_node_base *)0x0) {
    do {
      pSVar13 = LazyLocalGraph::getSetInfluences(this->localGraph,(LocalSet *)p_Var18[1]._M_nxt);
      for (p_Var19 = (pSVar13->_M_h)._M_before_begin._M_nxt; p_Var19 != (_Hash_node_base *)0x0;
          p_Var19 = p_Var19->_M_nxt) {
        local_d8 = (undefined1  [8])p_Var19[1]._M_nxt;
        auStack_58 = (undefined1  [8])&parent;
        std::
        _Hashtable<wasm::LocalGet*,wasm::LocalGet*,std::allocator<wasm::LocalGet*>,std::__detail::_Identity,std::equal_to<wasm::LocalGet*>,std::hash<wasm::LocalGet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<wasm::LocalGet*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::LocalGet*,false>>>>
                  ((_Hashtable<wasm::LocalGet*,wasm::LocalGet*,std::allocator<wasm::LocalGet*>,std::__detail::_Identity,std::equal_to<wasm::LocalGet*>,std::hash<wasm::LocalGet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)auStack_58,local_d8,auStack_58);
      }
      p_Var18 = p_Var18->_M_nxt;
    } while (p_Var18 != (_Hash_node_base *)0x0);
    if (gets._M_h._M_bucket_count != 0) {
      plVar20 = (long *)gets._M_h._M_bucket_count;
      do {
        local_d8 = (undefined1  [8])LazyLocalGraph::getSets(this->localGraph,(LocalGet *)plVar20[1])
        ;
        get._0_1_ = (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                       *)local_d8)->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
        local_40._M_node = (_Rb_tree_node_base *)0x0;
        auStack_58 = local_d8;
        set._0_1_ = get._0_1_;
        if ((bool)get._0_1_) {
          local_48 = 0;
          local_c8 = (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                        *)local_d8)->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
          local_c0._M_node = (_Base_ptr)0x0;
        }
        else {
          local_40._M_node =
               (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                  *)local_d8)->flexible)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_c0._M_node =
               &(((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                   *)local_d8)->flexible)._M_t._M_impl.super__Rb_tree_header._M_header;
        }
        while (bVar6 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                       ::
                       IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                       ::operator==((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                                     *)auStack_58,(Iterator *)local_d8), !bVar6) {
          p_Var16 = local_40._M_node + 1;
          if ((char)set != '\0') {
            p_Var16 = (_Rb_tree_node_base *)
                      ((((OrderedFixedStorage<wasm::LocalSet_*,_2UL> *)auStack_58)->
                       super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage._M_elems + local_48);
          }
          gets._M_h._M_single_bucket = *(__node_base_ptr *)p_Var16;
          cVar14 = std::
                   _Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find(local_a8,(key_type *)&gets._M_h._M_single_bucket);
          if (cVar14.super__Node_iterator_base<wasm::LocalSet_*,_false>._M_cur == (__node_type *)0x0
             ) {
            std::
            _Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable((_Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)&parent);
            pVar25.second = (Expression *)__h;
            pVar25.first = (Expression *)local_b8;
            goto switchD_008b4407_caseD_2;
          }
          if ((char)set == '\x01') {
            local_48 = local_48 + 1;
          }
          else {
            local_40._M_node = (_Base_ptr)std::_Rb_tree_increment(local_40._M_node);
          }
        }
        plVar20 = (long *)*plVar20;
      } while (plVar20 != (long *)0x0);
    }
  }
  std::
  _Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&parent);
  pVar25.second = (Expression *)__h;
  pVar25.first = (Expression *)local_b8;
  bVar6 = false;
LAB_008b4a6d:
  __h = (__hashtable *)pVar25.second;
  local_b8 = (SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
              *)pVar25.first;
  std::
  _Hashtable<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::hash<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::hash<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&flows.
                    super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>.
                    count._M_h._M_single_bucket);
  std::
  _Hashtable<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::pair<const_std::pair<wasm::Expression_*,_wasm::Expression_*>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<wasm::Expression_*,_wasm::Expression_*>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::hash<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::pair<const_std::pair<wasm::Expression_*,_wasm::Expression_*>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<wasm::Expression_*,_wasm::Expression_*>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::hash<std::pair<wasm::Expression_*,_wasm::Expression_*>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)((long)&flows.
                           super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>
                           .data.c.
                           super__Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
                           ._M_impl.super__Deque_impl_data + 0x48));
  std::
  _Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
  ::~_Deque_base((_Deque_base<std::pair<wasm::Expression_*,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*,_wasm::Expression_*>_>_>
                  *)auStack_1a8);
  return bVar6;
}

Assistant:

bool escapes(Expression* allocation) {
    // A queue of flows from children to parents. When something is in the queue
    // here then it assumed that it is ok for the allocation to be at the child
    // (that is, we have already checked the child before placing it in the
    // queue), and we need to check if it is ok to be at the parent, and to flow
    // from the child to the parent. We will analyze that (see
    // ParentChildInteraction, above) and continue accordingly.
    using ChildAndParent = std::pair<Expression*, Expression*>;
    UniqueNonrepeatingDeferredQueue<ChildAndParent> flows;

    // Start the flow from the allocation itself to its parent.
    flows.push({allocation, parents.getParent(allocation)});

    // Keep flowing while we can.
    while (!flows.empty()) {
      auto flow = flows.pop();
      auto* child = flow.first;
      auto* parent = flow.second;

      auto interaction = getParentChildInteraction(allocation, parent, child);
      if (interaction == ParentChildInteraction::Escapes ||
          interaction == ParentChildInteraction::Mixes) {
        // If the parent may let us escape, or the parent mixes other values
        // up with us, give up.
        return true;
      }

      // The parent either fully consumes us, or flows us onwards; either way,
      // we can proceed here, hopefully.
      assert(interaction == ParentChildInteraction::FullyConsumes ||
             interaction == ParentChildInteraction::Flows);

      // We can proceed, as the parent interacts with us properly, and we are
      // the only allocation to get here.

      if (interaction == ParentChildInteraction::Flows) {
        // The value flows through the parent; we need to look further at the
        // grandparent.
        flows.push({parent, parents.getParent(parent)});
      }

      if (auto* set = parent->dynCast<LocalSet>()) {
        // This is one of the sets we are written to, and so we must check for
        // exclusive use of our allocation by all the gets that read the value.
        // Note the set, and we will check the gets at the end once we know all
        // of our sets.
        sets.insert(set);

        // We must also look at how the value flows from those gets.
        for (auto* get : localGraph.getSetInfluences(set)) {
          flows.push({get, parents.getParent(get)});
        }
      }

      // If the parent may send us on a branch, we will need to look at the flow
      // to the branch target(s).
      for (auto name : branchesSentByParent(child, parent)) {
        flows.push({child, branchTargets.getTarget(name)});
      }

      // If we got to here, then we can continue to hope that we can optimize
      // this allocation. Mark the parent and child as reached by it, and
      // continue. The child flows the value to the parent, and the parent's
      // behavior was computed before.
      reachedInteractions[child] = ParentChildInteraction::Flows;
      reachedInteractions[parent] = interaction;
    }

    // We finished the loop over the flows. Do the final checks.
    if (!getsAreExclusiveToSets()) {
      return true;
    }

    // Nothing escapes, hurray!
    return false;
  }